

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.c
# Opt level: O0

int http_message_needs_eof(http_parser *parser)

{
  http_parser *parser_local;
  
  if (((undefined1  [32])*parser & (undefined1  [32])0x3) == (undefined1  [32])0x0) {
    parser_local._4_4_ = 0;
  }
  else if (((((*(uint *)&parser->field_0x14 & 0xffff) / 100 == 1) ||
            ((*(uint *)&parser->field_0x14 & 0xffff) == 0xcc)) ||
           ((*(uint *)&parser->field_0x14 & 0xffff) == 0x130)) ||
          ((*(uint *)parser >> 2 & 0x40) != 0)) {
    parser_local._4_4_ = 0;
  }
  else if (((*(uint *)parser >> 0x1d & 1) == 0) || ((*(uint *)parser >> 2 & 1) != 0)) {
    if (((*(uint *)parser >> 2 & 1) == 0) && (parser->content_length == 0xffffffffffffffff)) {
      parser_local._4_4_ = 1;
    }
    else {
      parser_local._4_4_ = 0;
    }
  }
  else {
    parser_local._4_4_ = 1;
  }
  return parser_local._4_4_;
}

Assistant:

int
http_message_needs_eof (const http_parser *parser)
{
  if (parser->type == HTTP_REQUEST) {
    return 0;
  }

  /* See RFC 2616 section 4.4 */
  if (parser->status_code / 100 == 1 || /* 1xx e.g. Continue */
      parser->status_code == 204 ||     /* No Content */
      parser->status_code == 304 ||     /* Not Modified */
      parser->flags & F_SKIPBODY) {     /* response to a HEAD request */
    return 0;
  }

  /* RFC 7230 3.3.3, see `s_headers_almost_done` */
  if ((parser->extra_flags & (F_TRANSFER_ENCODING >> 8)) &&
      (parser->flags & F_CHUNKED) == 0) {
    return 1;
  }

  if ((parser->flags & F_CHUNKED) || parser->content_length != ULLONG_MAX) {
    return 0;
  }

  return 1;
}